

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-x11.c
# Opt level: O0

errr Term_xtra_x11_level(wchar_t v)

{
  term_data *td;
  wchar_t v_local;
  
  if (v != L'\0') {
    Infowin = *(infowin **)((long)Term->data + 0xe0);
    Infofnt = *(infofnt **)((long)Term->data + 0xd8);
  }
  return 0;
}

Assistant:

static errr Term_xtra_x11_level(int v)
{
	term_data *td = (term_data*)(Term->data);

	/* Handle "activate" */
	if (v) {
		/* Activate the window */
		Infowin_set(td->win);

		/* Activate the font */
		Infofnt_set(td->fnt);
	}

	/* Success */
	return (0);
}